

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool TaprootBuilder::ValidDepths(vector<int,_std::allocator<int>_> *depths)

{
  uint *puVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  _Bit_type *p_Var10;
  uint *puVar11;
  long in_FS_OFFSET;
  vector<bool,_std::allocator<bool>_> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  puVar11 = (uint *)(depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  puVar1 = (uint *)(depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar11 == puVar1) {
    p_Var10 = (_Bit_type *)0x0;
  }
  else {
    p_Var10 = (_Bit_type *)0x0;
    do {
      uVar9 = (ulong)*puVar11;
      if (0x80 < uVar9) goto LAB_001b2f16;
      uVar6 = (ulong)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      uVar3 = uVar6 + ((long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)p_Var10) * 8;
      p_Var2 = local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p;
      if (uVar9 + 1 < uVar3) goto LAB_001b2f16;
      while (uVar8 = (uint)uVar9, uVar9 < uVar3) {
        uVar3 = uVar9 >> 6;
        if ((p_Var10[uVar3] >> (uVar9 & 0x3f) & 1) == 0) goto LAB_001b2ecd;
        iVar5 = (int)uVar6;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = iVar5 - 1;
        uVar6 = (ulong)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        if (iVar5 == 0) {
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
          p_Var2 = p_Var2 + -1;
          uVar6 = 0x3f;
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = p_Var2;
        }
        if (uVar8 == 0) {
          bVar7 = false;
          goto LAB_001b2f21;
        }
        uVar3 = uVar6 + ((long)p_Var2 - (long)p_Var10) * 8;
        uVar9 = (ulong)(uVar8 - 1);
      }
      std::vector<bool,_std::allocator<bool>_>::resize(&local_60,uVar9 + 1,false);
      uVar3 = (ulong)(uVar8 >> 6);
      p_Var10 = local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
LAB_001b2ecd:
      uVar9 = 1L << ((byte)uVar9 & 0x3f);
      if ((p_Var10[uVar3] & uVar9) != 0) {
        __assert_fail("!branch[depth]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                      ,0x167,"static bool TaprootBuilder::ValidDepths(const std::vector<int> &)");
      }
      p_Var10[uVar3] = p_Var10[uVar3] | uVar9;
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar1);
    uVar9 = (ulong)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  }
  lVar4 = ((long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var10) *
          8 + uVar9;
  if (lVar4 == 0) {
    bVar7 = true;
LAB_001b2f1c:
    if (p_Var10 == (_Bit_type *)0x0) goto LAB_001b2f2e;
  }
  else {
    if (lVar4 != 1) {
LAB_001b2f16:
      bVar7 = false;
      goto LAB_001b2f1c;
    }
    bVar7 = (bool)((byte)*p_Var10 & 1);
  }
LAB_001b2f21:
  operator_delete(p_Var10,(long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage - (long)p_Var10);
LAB_001b2f2e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool TaprootBuilder::ValidDepths(const std::vector<int>& depths)
{
    std::vector<bool> branch;
    for (int depth : depths) {
        // This inner loop corresponds to effectively the same logic on branch
        // as what Insert() performs on the m_branch variable. Instead of
        // storing a NodeInfo object, just remember whether or not there is one
        // at that depth.
        if (depth < 0 || (size_t)depth > TAPROOT_CONTROL_MAX_NODE_COUNT) return false;
        if ((size_t)depth + 1 < branch.size()) return false;
        while (branch.size() > (size_t)depth && branch[depth]) {
            branch.pop_back();
            if (depth == 0) return false;
            --depth;
        }
        if (branch.size() <= (size_t)depth) branch.resize((size_t)depth + 1);
        assert(!branch[depth]);
        branch[depth] = true;
    }
    // And this check corresponds to the IsComplete() check on m_branch.
    return branch.size() == 0 || (branch.size() == 1 && branch[0]);
}